

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

uint64_t __thiscall
nivalis::Environment::addr_of(Environment *this,string *var_name,bool mode_explicit)

{
  ulong uVar1;
  const_iterator cVar2;
  ulong uVar3;
  long *local_40 [2];
  long local_30 [2];
  
  (this->error_msg)._M_string_length = 0;
  *(this->error_msg)._M_dataplus._M_p = '\0';
  if (*(var_name->_M_dataplus)._M_p == '&') {
    std::__cxx11::string::substr((ulong)local_40,(ulong)var_name);
    uVar1 = atoll((char *)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    uVar3 = 0xffffffffffffffff;
    if ((-1 < (long)uVar1) &&
       (uVar3 = 0xffffffffffffffff,
       uVar1 < (ulong)((long)(this->vars).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3))) {
      uVar3 = uVar1;
    }
  }
  else {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::find(&(this->vreg)._M_t,var_name);
    if ((_Rb_tree_header *)cVar2._M_node == &(this->vreg)._M_t._M_impl.super__Rb_tree_header) {
      uVar3 = 0xffffffffffffffff;
    }
    else {
      uVar3 = *(ulong *)(cVar2._M_node + 2);
    }
  }
  return uVar3;
}

Assistant:

uint64_t Environment::addr_of(const std::string& var_name,
        bool mode_explicit) const {
    error_msg.clear();
    if (var_name[0] == '&') {
        // Address
        int64_t addr = std::atoll(var_name.substr(1).c_str());
        return (addr < 0 || static_cast<size_t>(addr) >= vars.size()) ?
            -1 : static_cast<uint64_t>(addr);
    }
    auto it = vreg.find(var_name);
    return it != vreg.end() ? it->second : -1;
}